

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int singlematch(MatchState *ms,char *s,char *p,char *ep)

{
  char cVar1;
  uint c_00;
  int c;
  char *ep_local;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  if (s < ms->src_end) {
    c_00 = (uint)(byte)*s;
    cVar1 = *p;
    if (cVar1 == '%') {
      ms_local._4_4_ = match_class(c_00,(uint)(byte)p[1]);
    }
    else if (cVar1 == '.') {
      ms_local._4_4_ = 1;
    }
    else if (cVar1 == '[') {
      ms_local._4_4_ = matchbracketclass(c_00,p,ep + -1);
    }
    else {
      ms_local._4_4_ = (uint)((byte)*p == c_00);
    }
  }
  else {
    ms_local._4_4_ = 0;
  }
  return ms_local._4_4_;
}

Assistant:

static int singlematch (MatchState *ms, const char *s, const char *p,
                        const char *ep) {
  if (s >= ms->src_end)
    return 0;
  else {
    int c = uchar(*s);
    switch (*p) {
      case '.': return 1;  /* matches any char */
      case L_ESC: return match_class(c, uchar(*(p+1)));
      case '[': return matchbracketclass(c, p, ep-1);
      default:  return (uchar(*p) == c);
    }
  }
}